

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_ElfParser.cpp
# Opt level: O2

int __thiscall axl::sys::lnx::ElfParser::close(ElfParser *this,int __fd)

{
  int in_EAX;
  
  this->m_stringTable = (char *)0x0;
  this->m_stringTableSize = 0;
  this->m_shdrTable = (Elf64_Shdr *)0x0;
  this->m_phdrTable = (Elf64_Phdr *)0x0;
  this->m_fileSize = 0;
  this->m_elfHdr = (Elf64_Ehdr *)0x0;
  return in_EAX;
}

Assistant:

void
ElfParser::close() {
	m_fileSize = 0;
	m_elfHdr = NULL;
	m_shdrTable = NULL;
	m_phdrTable = NULL;
	m_stringTable = NULL;
	m_stringTableSize = 0;
}